

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

pointer __thiscall
slang::SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>::
emplaceRealloc<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
          (SmallVectorBase<std::pair<slang::ast::ValueSymbol_const*,slang::ast::Expression_const*>>
           *this,pointer pos,
          pair<const_slang::ast::ValueSymbol_*,_const_slang::ast::Expression_*> *args)

{
  undefined8 *puVar1;
  ulong uVar2;
  pointer p;
  Expression *pEVar3;
  undefined8 uVar4;
  pointer ppVar5;
  undefined8 *puVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  
  if (*(long *)(this + 8) == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar9 = *(long *)(this + 8) + 1;
  uVar2 = *(ulong *)(this + 0x10);
  if (uVar9 < uVar2 * 2) {
    uVar9 = uVar2 * 2;
  }
  if (0x7ffffffffffffff - uVar2 < uVar2) {
    uVar9 = 0x7ffffffffffffff;
  }
  lVar10 = (long)pos - *(long *)this;
  puVar6 = (undefined8 *)operator_new(uVar9 << 4);
  pEVar3 = args->second;
  *(undefined8 *)((long)puVar6 + lVar10) = args->first;
  ((undefined8 *)((long)puVar6 + lVar10))[1] = pEVar3;
  p = *(pointer *)this;
  lVar7 = *(long *)(this + 8) * 0x10;
  lVar8 = (long)p + (lVar7 - (long)pos);
  ppVar5 = p;
  puVar1 = puVar6;
  if (lVar8 == 0) {
    if (*(long *)(this + 8) != 0) {
      lVar8 = 0;
      do {
        puVar1 = (undefined8 *)((long)&p->first + lVar8);
        uVar4 = puVar1[1];
        *(undefined8 *)((long)puVar6 + lVar8) = *puVar1;
        ((undefined8 *)((long)puVar6 + lVar8))[1] = uVar4;
        lVar8 = lVar8 + 0x10;
      } while (lVar7 != lVar8);
    }
  }
  else {
    for (; ppVar5 != pos; ppVar5 = ppVar5 + 1) {
      pEVar3 = ppVar5->second;
      *puVar1 = ppVar5->first;
      puVar1[1] = pEVar3;
      puVar1 = puVar1 + 2;
    }
    memcpy((void *)((long)puVar6 + lVar10 + 0x10),pos,(lVar8 - 0x10U & 0xfffffffffffffff0) + 0x10);
  }
  if (p != (pointer)(this + 0x18)) {
    operator_delete(p);
  }
  *(long *)(this + 8) = *(long *)(this + 8) + 1;
  *(ulong *)(this + 0x10) = uVar9;
  *(undefined8 **)this = puVar6;
  return (pointer)((long)puVar6 + lVar10);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}